

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zreadrb.c
# Opt level: O1

void zreadrb(int *nrow,int *ncol,int_t *nonz,doublecomplex **nzval,int_t **rowind,int_t **colptr)

{
  long lVar1;
  byte bVar2;
  int_t *addr;
  int_t *addr_00;
  doublecomplex *pdVar3;
  bool bVar4;
  FILE *__stream;
  int iVar5;
  uint uVar6;
  byte *pbVar7;
  long lVar8;
  int_t *__s;
  doublecomplex *pdVar9;
  int_t *addr_01;
  void *addr_02;
  int_t *piVar10;
  int_t *piVar11;
  doublecomplex *pdVar12;
  ulong uVar13;
  double *pdVar14;
  int iVar15;
  ulong uVar16;
  ulong uVar17;
  int_t *piVar18;
  long lVar19;
  byte *__nptr;
  doublecomplex *z;
  int iVar20;
  long lVar21;
  double dVar22;
  int tmp;
  int rowsize;
  int rownum;
  int colsize;
  int colnum;
  char type [4];
  char buf_1 [100];
  char buf [100];
  int local_238;
  double local_200;
  int local_1ec;
  doublecomplex **local_1e8;
  int_t **local_1e0;
  int_t **local_1d8;
  int_t *local_1d0;
  ulong local_1c8;
  doublecomplex *local_1c0;
  int local_1b4;
  int local_1b0;
  int local_1ac;
  int local_1a8;
  undefined1 local_1a4;
  byte local_1a3;
  undefined1 local_1a1;
  long local_1a0;
  byte local_198 [256];
  byte local_98 [14];
  undefined1 local_8a;
  
  __stream = _stdin;
  local_1e8 = nzval;
  local_1e0 = rowind;
  local_1d8 = colptr;
  local_1d0 = nonz;
  fgets((char *)local_98,100,_stdin);
  fputs((char *)local_98,_stdout);
  iVar20 = 4;
  iVar15 = 0;
  do {
    __isoc99_fscanf(__stream,"%14c",local_98);
    local_8a = 0;
    __isoc99_sscanf(local_98,"%d",&local_1ec);
    if (iVar20 == 1) {
      iVar15 = local_1ec;
    }
    iVar20 = iVar20 + -1;
  } while (iVar20 != 0);
  do {
    iVar20 = fgetc(__stream);
  } while (iVar20 != 10);
  __isoc99_fscanf(__stream,"%3c",&local_1a4);
  pbVar7 = local_98;
  __isoc99_fscanf(__stream,"%11c",pbVar7);
  local_1a1 = 0;
  __isoc99_fscanf(__stream,"%14c",pbVar7);
  iVar20 = atoi((char *)pbVar7);
  *nrow = iVar20;
  __isoc99_fscanf(__stream,"%14c",pbVar7);
  iVar20 = atoi((char *)pbVar7);
  *ncol = iVar20;
  __isoc99_fscanf(__stream,"%14c",pbVar7);
  iVar20 = atoi((char *)pbVar7);
  piVar10 = local_1d0;
  *local_1d0 = iVar20;
  __isoc99_fscanf(__stream,"%14c",pbVar7);
  local_1ec = atoi((char *)pbVar7);
  if (local_1ec != 0) {
    puts("This is not an assembled matrix!");
  }
  if (*nrow != *ncol) {
    puts("Matrix is not square.");
  }
  do {
    iVar20 = fgetc(__stream);
  } while (iVar20 != 10);
  zallocateA(*ncol,*piVar10,local_1e8,local_1e0,local_1d8);
  __isoc99_fscanf(__stream,"%16c",pbVar7);
  zParseIntFormat((char *)pbVar7,&local_1a8,&local_1ac);
  __isoc99_fscanf(__stream,"%16c",pbVar7);
  zParseIntFormat((char *)pbVar7,&local_1b0,&local_1b4);
  __isoc99_fscanf(__stream,"%20c",pbVar7);
  do {
    bVar2 = *pbVar7;
    pbVar7 = pbVar7 + 1;
  } while (bVar2 != 0x28);
  local_238 = atoi((char *)pbVar7);
  while( true ) {
    do {
      piVar10 = local_1d0;
      __nptr = pbVar7 + 1;
      uVar6 = *pbVar7 - 0x44;
      pbVar7 = __nptr;
    } while (0x2c < uVar6);
    if ((0x700000007U >> ((ulong)uVar6 & 0x3f) & 1) != 0) break;
    if ((0x100000001000U >> ((ulong)uVar6 & 0x3f) & 1) != 0) {
      local_238 = atoi((char *)__nptr);
    }
  }
  for (; (*pbVar7 != 0x29 && (*pbVar7 != 0x2e)); pbVar7 = pbVar7 + 1) {
  }
  *pbVar7 = 0;
  iVar20 = atoi((char *)__nptr);
  local_1c8 = CONCAT44(local_1c8._4_4_,iVar20);
  do {
    iVar20 = fgetc(__stream);
  } while (iVar20 != 10);
  ReadVector((FILE *)__stream,*ncol + 1,*local_1d8,local_1a8,local_1ac);
  ReadVector((FILE *)__stream,*piVar10,*local_1e0,local_1b0,local_1b4);
  if ((iVar15 != 0) && (iVar15 = *piVar10, piVar10 = local_1d0, 0 < iVar15)) {
    local_1c0 = *local_1e8;
    iVar5 = (int)local_1c8;
    lVar19 = (long)(int)local_1c8;
    uVar17 = local_1c8 & 0xffffffff;
    iVar20 = 0;
    bVar4 = false;
    do {
      fgets((char *)local_198,100,__stream);
      if (0 < local_238) {
        uVar6 = 0;
        lVar8 = 0;
        do {
          pdVar3 = local_1c0;
          lVar1 = lVar8 + 1;
          lVar21 = lVar1 * lVar19;
          bVar2 = local_198[lVar21];
          local_198[lVar21] = 0;
          if (0 < iVar5) {
            uVar13 = 0;
            do {
              if ((local_198[uVar13 + uVar6] | 0x20) == 100) {
                local_198[uVar13 + uVar6] = 0x45;
              }
              uVar13 = uVar13 + 1;
            } while (uVar17 != uVar13);
          }
          lVar8 = lVar8 * lVar19;
          if (bVar4) {
            local_1c0[iVar20].r = local_200;
            dVar22 = atof((char *)(local_198 + lVar8));
            pdVar3[iVar20].i = dVar22;
            iVar20 = iVar20 + 1;
          }
          else {
            local_200 = atof((char *)(local_198 + lVar8));
          }
          bVar4 = !bVar4;
          local_198[lVar21] = bVar2;
          if (local_238 <= lVar1) break;
          uVar6 = uVar6 + (int)local_1c8;
          lVar8 = lVar1;
        } while (iVar20 < iVar15);
      }
      piVar10 = local_1d0;
    } while (iVar20 < iVar15);
  }
  if ((local_1a3 & 0xdf) != 0x53) goto LAB_0010698f;
  uVar6 = *ncol;
  uVar17 = (ulong)uVar6;
  addr = *local_1e0;
  addr_00 = *local_1d8;
  pdVar3 = *local_1e8;
  iVar15 = uVar6 + 1;
  __s = intMalloc(iVar15);
  if (__s == (int_t *)0x0) {
    sprintf((char *)local_198,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for marker[]",0xd2,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/zreadrb.c");
    superlu_abort_and_exit((char *)local_198);
  }
  pdVar9 = (doublecomplex *)intMalloc(iVar15);
  if (pdVar9 == (doublecomplex *)0x0) {
    sprintf((char *)local_198,"%s at line %d in file %s\n","SUPERLU_MALLOC t_colptr[]",0xd4,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/zreadrb.c");
    superlu_abort_and_exit((char *)local_198);
  }
  addr_01 = intMalloc(*piVar10);
  if (addr_01 == (int_t *)0x0) {
    sprintf((char *)local_198,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for t_rowind[]",
            0xd6,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/zreadrb.c");
    superlu_abort_and_exit((char *)local_198);
  }
  addr_02 = superlu_malloc((long)*piVar10 << 4);
  if (addr_02 == (void *)0x0) {
    sprintf((char *)local_198,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for t_val[]",0xd8,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/zreadrb.c");
    superlu_abort_and_exit((char *)local_198);
  }
  if ((int)uVar6 < 1) {
    *(int_t *)&pdVar9->r = 0;
LAB_00106663:
    if (0 < (int)uVar6) {
      uVar13 = 0;
      do {
        lVar19 = (long)addr_00[uVar13];
        uVar16 = uVar13 + 1;
        if (addr_00[uVar13] < addr_00[uVar13 + 1]) {
          pdVar12 = pdVar3 + lVar19;
          do {
            iVar20 = addr[lVar19];
            addr_01[__s[iVar20]] = (int_t)uVar13;
            dVar22 = pdVar12->i;
            pdVar14 = (double *)((long)addr_02 + (long)__s[iVar20] * 0x10);
            *pdVar14 = pdVar12->r;
            pdVar14[1] = dVar22;
            __s[iVar20] = __s[iVar20] + 1;
            lVar19 = lVar19 + 1;
            pdVar12 = pdVar12 + 1;
          } while (lVar19 < addr_00[uVar16]);
        }
        uVar13 = uVar16;
      } while (uVar16 != uVar17);
    }
  }
  else {
    memset(__s,0,uVar17 * 4);
    uVar13 = 0;
    do {
      lVar19 = (long)addr_00[uVar13];
      uVar16 = uVar13 + 1;
      if (addr_00[uVar13] < addr_00[uVar13 + 1]) {
        do {
          __s[addr[lVar19]] = __s[addr[lVar19]] + 1;
          lVar19 = lVar19 + 1;
        } while (lVar19 < addr_00[uVar16]);
      }
      uVar13 = uVar16;
    } while (uVar16 != uVar17);
    *(int_t *)&pdVar9->r = 0;
    if (0 < (int)uVar6) {
      uVar13 = 0;
      do {
        iVar20 = *(int *)((long)&pdVar9->r + uVar13 * 4);
        *(int_t *)((long)&pdVar9->r + uVar13 * 4 + 4) = __s[uVar13] + iVar20;
        __s[uVar13] = iVar20;
        uVar13 = uVar13 + 1;
      } while (uVar17 != uVar13);
      goto LAB_00106663;
    }
  }
  lVar19 = (long)*piVar10 * 2 - (long)(int)uVar6;
  piVar10 = intMalloc(iVar15);
  if (piVar10 == (int_t *)0x0) {
    sprintf((char *)local_198,"%s at line %d in file %s\n","SUPERLU_MALLOC a_colptr[]",0xf1,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/zreadrb.c");
    superlu_abort_and_exit((char *)local_198);
  }
  piVar11 = intMalloc((int_t)lVar19);
  if (piVar11 == (int_t *)0x0) {
    sprintf((char *)local_198,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for a_rowind[]",
            0xf3,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/zreadrb.c");
    superlu_abort_and_exit((char *)local_198);
  }
  local_1a0 = lVar19;
  pdVar12 = (doublecomplex *)superlu_malloc(lVar19 * 0x10);
  if (pdVar12 == (doublecomplex *)0x0) {
    sprintf((char *)local_198,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for a_val[]",0xf5,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/zreadrb.c");
    superlu_abort_and_exit((char *)local_198);
  }
  *piVar10 = 0;
  if (0 < (int)uVar6) {
    uVar6 = 0;
    uVar13 = 0;
    local_1c8 = uVar17;
    local_1c0 = pdVar9;
    do {
      iVar15 = *(int *)((long)&local_1c0->r + uVar13 * 4);
      lVar19 = (long)iVar15;
      uVar17 = uVar13 + 1;
      if (iVar15 < *(int *)((long)&local_1c0->r + uVar13 * 4 + 4)) {
        pdVar14 = (double *)(lVar19 * 0x10 + (long)addr_02);
        do {
          if (uVar13 != (uint)addr_01[lVar19]) {
            piVar11[(int)uVar6] = addr_01[lVar19];
            dVar22 = pdVar14[1];
            pdVar12[(int)uVar6].r = *pdVar14;
            pdVar12[(int)uVar6].i = dVar22;
            uVar6 = uVar6 + 1;
          }
          lVar19 = lVar19 + 1;
          pdVar14 = pdVar14 + 2;
        } while (lVar19 < *(int *)((long)&local_1c0->r + uVar13 * 4 + 4));
      }
      lVar19 = (long)addr_00[uVar13];
      if (addr_00[uVar13] < addr_00[uVar17]) {
        piVar18 = piVar11 + (int)uVar6;
        z = pdVar12 + (int)uVar6;
        pdVar9 = pdVar3 + lVar19;
        do {
          *piVar18 = addr[lVar19];
          dVar22 = pdVar9->i;
          z->r = pdVar9->r;
          z->i = dVar22;
          dVar22 = z_abs1(z);
          if (dVar22 < 4.047e-300) {
            printf("%5d: %e\t%e\n",z->r,z->i,(ulong)uVar6);
          }
          lVar19 = lVar19 + 1;
          uVar6 = uVar6 + 1;
          z = z + 1;
          piVar18 = piVar18 + 1;
          pdVar9 = pdVar9 + 1;
        } while (lVar19 < addr_00[uVar17]);
      }
      piVar10[uVar17] = uVar6;
      uVar13 = uVar17;
      pdVar9 = local_1c0;
    } while (uVar17 != local_1c8);
  }
  lVar19 = local_1a0;
  printf("FormFullA: new_nnz = %lld\n",local_1a0);
  superlu_free(pdVar3);
  superlu_free(addr);
  superlu_free(addr_00);
  superlu_free(__s);
  superlu_free(addr_02);
  superlu_free(addr_01);
  superlu_free(pdVar9);
  *local_1e8 = pdVar12;
  *local_1e0 = piVar11;
  *local_1d8 = piVar10;
  *local_1d0 = (int_t)lVar19;
LAB_0010698f:
  fclose(__stream);
  return;
}

Assistant:

void
zreadrb(int *nrow, int *ncol, int_t *nonz,
        doublecomplex **nzval, int_t **rowind, int_t **colptr)
{

    register int i, numer_lines = 0;
    int tmp, colnum, colsize, rownum, rowsize, valnum, valsize;
    char buf[100], type[4];
    int sym;
    FILE *fp;

    fp = stdin;

    /* Line 1 */
    fgets(buf, 100, fp);
    fputs(buf, stdout);

    /* Line 2 */
    for (i=0; i<4; i++) {
        fscanf(fp, "%14c", buf); buf[14] = 0;
        sscanf(buf, "%d", &tmp);
        if (i == 3) numer_lines = tmp;
    }
    zDumpLine(fp);

    /* Line 3 */
    fscanf(fp, "%3c", type);
    fscanf(fp, "%11c", buf); /* pad */
    type[3] = 0;
#ifdef DEBUG
    printf("Matrix type %s\n", type);
#endif

    fscanf(fp, "%14c", buf); *nrow = atoi(buf);
    fscanf(fp, "%14c", buf); *ncol = atoi(buf);
    fscanf(fp, "%14c", buf); *nonz = atoi(buf);
    fscanf(fp, "%14c", buf); tmp = atoi(buf);

    if (tmp != 0)
        printf("This is not an assembled matrix!\n");
    if (*nrow != *ncol)
        printf("Matrix is not square.\n");
    zDumpLine(fp);

    /* Allocate storage for the three arrays ( nzval, rowind, colptr ) */
    zallocateA(*ncol, *nonz, nzval, rowind, colptr);

    /* Line 4: format statement */
    fscanf(fp, "%16c", buf);
    zParseIntFormat(buf, &colnum, &colsize);
    fscanf(fp, "%16c", buf);
    zParseIntFormat(buf, &rownum, &rowsize);
    fscanf(fp, "%20c", buf);
    zParseFloatFormat(buf, &valnum, &valsize);
    zDumpLine(fp);

#ifdef DEBUG
    printf("%d rows, %lld nonzeros\n", *nrow, (long long) *nonz);
    printf("colnum %d, colsize %d\n", colnum, colsize);
    printf("rownum %d, rowsize %d\n", rownum, rowsize);
    printf("valnum %d, valsize %d\n", valnum, valsize);
#endif

    ReadVector(fp, *ncol+1, *colptr, colnum, colsize);
    ReadVector(fp, *nonz, *rowind, rownum, rowsize);
    if ( numer_lines ) {
        zReadValues(fp, *nonz, *nzval, valnum, valsize);
    }

    sym = (type[1] == 'S' || type[1] == 's');
    if ( sym ) {
	FormFullA(*ncol, nonz, nzval, rowind, colptr);
    }

    fclose(fp);
}